

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformLocationTests.cpp
# Opt level: O0

float deqp::gles31::Functional::anon_unknown_0::UniformLocationCase::getExpectedValue
                (DataType type,int id,char *name)

{
  bool bVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  uint uVar4;
  undefined4 local_28;
  DataType adjustedType;
  deUint32 hash;
  char *name_local;
  int id_local;
  DataType type_local;
  
  dVar2 = deStringHash(name);
  dVar3 = ::deInt32Hash(id);
  uVar4 = dVar2 + dVar3;
  bVar1 = glu::isDataTypeSampler(type);
  local_28 = type;
  if (bVar1) {
    local_28 = getDataTypeSamplerSampleType(type);
  }
  bVar1 = glu::isDataTypeIntOrIVec(local_28);
  if (bVar1) {
    id_local = (int)(float)(uVar4 & 0x7f);
  }
  else {
    bVar1 = glu::isDataTypeUintOrUVec(local_28);
    if (bVar1) {
      id_local = (int)(float)(uVar4 % 0xff);
    }
    else {
      bVar1 = glu::isDataTypeFloatOrVec(local_28);
      if (bVar1) {
        id_local = (int)((float)(uVar4 % 0xff) / 255.0);
      }
      else {
        bVar1 = glu::isDataTypeBoolOrBVec(local_28);
        if (bVar1) {
          id_local = (int)(float)(uVar4 & 1);
        }
        else {
          id_local = 0;
        }
      }
    }
  }
  return (float)id_local;
}

Assistant:

float UniformLocationCase::getExpectedValue (glu::DataType type, int id, const char* name)
{
	const deUint32	hash			= deStringHash(name) + deInt32Hash(id);

	glu::DataType	adjustedType	= type;

	if (glu::isDataTypeSampler(type))
		adjustedType = getDataTypeSamplerSampleType(type);

	if (glu::isDataTypeIntOrIVec(adjustedType))
		return float(hash%128);
	else if (glu::isDataTypeUintOrUVec(adjustedType))
		return float(hash%255);
	else if (glu::isDataTypeFloatOrVec(adjustedType))
		return float(hash%255)/255.0f;
	else if (glu::isDataTypeBoolOrBVec(adjustedType))
		return float(hash%2);
	else
		DE_FATAL("Unkown primitive type");

	return glu::TYPE_INVALID;
}